

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O2

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  secp256k1_fe y;
  secp256k1_fe x_1;
  secp256k1_fe x;
  secp256k1_fe x3;
  secp256k1_fe local_c0;
  secp256k1_fe local_98;
  secp256k1_fe local_70;
  secp256k1_fe local_48;
  
  iVar2 = 0;
  if (size == 0x41) {
    if ((*pub < 8) && ((0xd0U >> (*pub & 0x1f) & 1) != 0)) {
      iVar3 = secp256k1_fe_set_b32(&local_98,pub + 1);
      iVar2 = 0;
      if ((iVar3 != 0) && (iVar3 = secp256k1_fe_set_b32(&local_c0,pub + 0x21), iVar3 != 0)) {
        elem->infinity = 0;
        (elem->x).n[4] = local_98.n[4];
        (elem->x).n[2] = local_98.n[2];
        (elem->x).n[3] = local_98.n[3];
        (elem->x).n[0] = local_98.n[0];
        (elem->x).n[1] = local_98.n[1];
        (elem->y).n[4] = local_c0.n[4];
        (elem->y).n[2] = local_c0.n[2];
        (elem->y).n[3] = local_c0.n[3];
        (elem->y).n[0] = CONCAT71(local_c0.n[0]._1_7_,(byte)local_c0.n[0]);
        (elem->y).n[1] = local_c0.n[1];
        if (((*pub & 0xfe) != 6) || ((*pub != 7) != (bool)((byte)local_c0.n[0] & 1))) {
          secp256k1_fe_sqr(&local_70,&elem->y);
          secp256k1_fe_sqr(&local_48,&elem->x);
          secp256k1_fe_mul(&local_48,&local_48,&elem->x);
          secp256k1_fe_add(&local_48,&secp256k1_fe_const_b);
          secp256k1_fe_normalize_weak(&local_48);
          iVar2 = secp256k1_fe_equal_var(&local_70,&local_48);
        }
      }
    }
  }
  else {
    iVar2 = 0;
    if ((size == 0x21) && (bVar1 = *pub, (bVar1 & 0xfe) == 2)) {
      iVar2 = secp256k1_fe_set_b32(&local_70,pub + 1);
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = secp256k1_ge_set_xo_var(elem,&local_70,(uint)(bVar1 == 3));
      }
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32(&x, pub+1) || !secp256k1_fe_set_b32(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}